

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

int cJSON_GetArraySize(cJSON *array)

{
  int iVar1;
  size_t i;
  cJSON *c;
  cJSON *array_local;
  
  iVar1 = 0;
  for (i = (size_t)array->child; i != 0; i = *(size_t *)i) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

CJSON_PUBLIC(int) cJSON_GetArraySize(const cJSON *array)
{
    cJSON *c = array->child;
    size_t i = 0;
    while(c)
    {
        i++;
        c = c->next;
    }

    /* FIXME: Can overflow here. Cannot be fixed without breaking the API */

    return (int)i;
}